

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  element_type *peVar1;
  int iVar2;
  Recognition *this;
  long lVar3;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  allocator local_1d1;
  long statusCode;
  string imgPath3;
  string local_1a8 [32];
  shared_ptr<TUPU::TImage> timg;
  string imgPath4;
  string result;
  allocator local_138 [32];
  string imgPath1;
  vector<std::shared_ptr<TUPU::TImage>,_std::allocator<std::shared_ptr<TUPU::TImage>_>_> images3;
  string imgUrl;
  string secretId;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  images2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  images1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  string imgPath2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sequenceIds;
  
  std::__cxx11::string::string((string *)&secretId,"your_secret_id",(allocator *)&imgPath3);
  this = (Recognition *)operator_new(0x88);
  std::__cxx11::string::string
            ((string *)&imgPath3,"Path-of-Your-PKCS8-Private-Key",(allocator *)&result);
  TUPU::Recognition::Recognition(this,&imgPath3);
  std::__cxx11::string::~string((string *)&imgPath3);
  result._M_dataplus._M_p = (pointer)&result.field_2;
  result._M_string_length = 0;
  result.field_2._M_local_buf[0] = '\0';
  statusCode = 0;
  std::__cxx11::string::string((string *)&imgPath3,"Funny",(allocator *)&imgUrl);
  __l._M_len = 1;
  __l._M_array = &imgPath3;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&tags,__l,(allocator_type *)&imgPath1);
  std::__cxx11::string::~string((string *)&imgPath3);
  std::__cxx11::string::string((string *)&imgPath3,"SequenceA",(allocator *)&imgUrl);
  __l_00._M_len = 1;
  __l_00._M_array = &imgPath3;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&sequenceIds,__l_00,(allocator_type *)&imgPath1);
  std::__cxx11::string::~string((string *)&imgPath3);
  lVar3 = getTime();
  std::__cxx11::string::string
            ((string *)&imgUrl,"http://www.yourdomain.com/img/1.jpg",(allocator *)&imgPath3);
  std::__cxx11::string::string((string *)&imgPath3,(string *)&imgUrl);
  __l_01._M_len = 1;
  __l_01._M_array = &imgPath3;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&images1,__l_01,(allocator_type *)&imgPath1);
  std::__cxx11::string::~string((string *)&imgPath3);
  iVar2 = TUPU::Recognition::performWithURL
                    (this,&secretId,&result,&statusCode,&images1,&tags,&sequenceIds);
  printResult("using image URL with tag & sequenceId",iVar2,statusCode,&result,lVar3);
  std::__cxx11::string::string((string *)&imgPath1,"/home/user/img/1.jpg",(allocator *)&imgPath3);
  std::__cxx11::string::string((string *)&imgPath2,"/home/user/img/2.jpg",(allocator *)&imgPath3);
  std::__cxx11::string::string((string *)&imgPath3,(string *)&imgPath1);
  std::__cxx11::string::string(local_1a8,(string *)&imgPath2);
  __l_02._M_len = 2;
  __l_02._M_array = &imgPath3;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&images2,__l_02,(allocator_type *)&imgPath4);
  lVar3 = 0x20;
  do {
    std::__cxx11::string::~string(local_1a8 + lVar3 + -0x20);
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  lVar3 = getTime();
  imgPath3._M_dataplus._M_p = (pointer)0x0;
  imgPath3._M_string_length = 0;
  imgPath3.field_2._M_allocated_capacity = 0;
  imgPath4._M_dataplus._M_p = (pointer)0x0;
  imgPath4._M_string_length = 0;
  imgPath4.field_2._M_allocated_capacity = 0;
  iVar2 = TUPU::Recognition::performWithPath
                    (this,&secretId,&result,&statusCode,&images2,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&imgPath3,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&imgPath4);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&imgPath4);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&imgPath3);
  printResult("using image path",iVar2,statusCode,&result,lVar3);
  lVar3 = getTime();
  std::__cxx11::string::string((string *)&imgPath3,"/home/user/img/3.jpg",(allocator *)&imgPath4);
  std::__cxx11::string::string((string *)&imgPath4,"/home/user/img/4.jpg",local_138);
  images3.
  super__Vector_base<std::shared_ptr<TUPU::TImage>,_std::allocator<std::shared_ptr<TUPU::TImage>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  images3.
  super__Vector_base<std::shared_ptr<TUPU::TImage>,_std::allocator<std::shared_ptr<TUPU::TImage>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  images3.
  super__Vector_base<std::shared_ptr<TUPU::TImage>,_std::allocator<std::shared_ptr<TUPU::TImage>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  loadImage(&images3,imgPath3._M_dataplus._M_p,"Room102","xxx111");
  std::make_shared<TUPU::TImage>();
  TUPU::TImage::setPath
            (timg.super___shared_ptr<TUPU::TImage,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&imgPath4);
  peVar1 = timg.super___shared_ptr<TUPU::TImage,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string((string *)local_138,"Room103",&local_1d1);
  std::__cxx11::string::_M_assign((string *)&peVar1->m_tag);
  std::__cxx11::string::~string((string *)local_138);
  std::__cxx11::string::string((string *)local_138,"xxx123",&local_1d1);
  std::__cxx11::string::_M_assign
            ((string *)
             &(timg.super___shared_ptr<TUPU::TImage,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              m_sequenceId);
  std::__cxx11::string::~string((string *)local_138);
  std::vector<std::shared_ptr<TUPU::TImage>,_std::allocator<std::shared_ptr<TUPU::TImage>_>_>::
  push_back(&images3,&timg);
  iVar2 = TUPU::Recognition::perform(this,&secretId,&images3,&result,&statusCode);
  printResult("using image binary with tag & sequenceId",iVar2,statusCode,&result,lVar3);
  (*this->_vptr_Recognition[1])(this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&timg.super___shared_ptr<TUPU::TImage,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::vector<std::shared_ptr<TUPU::TImage>,_std::allocator<std::shared_ptr<TUPU::TImage>_>_>::
  ~vector(&images3);
  std::__cxx11::string::~string((string *)&imgPath4);
  std::__cxx11::string::~string((string *)&imgPath3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&images2);
  std::__cxx11::string::~string((string *)&imgPath2);
  std::__cxx11::string::~string((string *)&imgPath1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&images1);
  std::__cxx11::string::~string((string *)&imgUrl);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&sequenceIds);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&tags);
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::~string((string *)&secretId);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    string secretId = "your_secret_id";
    Recognition *rec = new Recognition("Path-of-Your-PKCS8-Private-Key");

    //Set sub-user identifier for billing and statistics (optional feature)
    // int rs = rec->setUID("user-bucket-xyz");
    // if (rs != 0) {
    //     return rs;
    // }

    string result;
    long statusCode = 0;
    int rc = 0;
    vector<string> tags = {"Funny"}; //number of tags may be less than number of images
    vector<string> sequenceIds = {"SequenceA"}; //number of sequenceIds may be less than number of images
    long start = getTime();

    /*********** imageUrl *****************/
    //Providing URLs of images with tags & sequenceIds (optional)
    string imgUrl = "http://www.yourdomain.com/img/1.jpg";
    vector<string> images1 = { imgUrl };
    rc = rec->performWithURL(secretId, result, &statusCode, images1, tags, sequenceIds);
    printResult("using image URL with tag & sequenceId", rc, statusCode, result, start);
    /*************************************/

    /*********** imagePath *****************/
    string imgPath1 = "/home/user/img/1.jpg";
    string imgPath2 = "/home/user/img/2.jpg";
    vector<string> images2 = { imgPath1, imgPath2 };
    start = getTime();
    //Providing paths of images without tags (optional)
    rc = rec->performWithPath(secretId, result, &statusCode, images2);
    printResult("using image path", rc, statusCode, result, start);
    /*************************************/

    /*********** imageContent *****************/
    start = getTime();
    // Providing image binary and path
    string imgPath3 = "/home/user/img/3.jpg";
    string imgPath4 = "/home/user/img/4.jpg";
    vector<shared_ptr<TImage>> images3;
    loadImage(images3, imgPath3.c_str(), "Room102", "xxx111");
    shared_ptr<TImage> timg = std::make_shared<TImage>();
    timg->setPath(imgPath4);
    timg->setTag("Room103");
    timg->setSequenceId("xxx123");
    images3.push_back(timg);
    rc = rec->perform(secretId, images3, result, &statusCode);
    printResult("using image binary with tag & sequenceId", rc, statusCode, result, start);
    /*************************************/

    delete rec;

    return 0;
}